

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O2

uint __thiscall agg::curve3_inc::vertex(curve3_inc *this,double *x,double *y)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = *(int *)(this + 4);
  if (iVar2 < 0) {
    return 0;
  }
  if (iVar2 == *(int *)this) {
    *x = *(double *)(this + 0x10);
    *y = *(double *)(this + 0x18);
    uVar1 = 1;
  }
  else {
    if (iVar2 == 0) {
      *x = *(double *)(this + 0x20);
      *y = *(double *)(this + 0x28);
      uVar1 = 2;
      iVar2 = -1;
      goto LAB_00111145;
    }
    dVar3 = *(double *)(this + 0x30) + *(double *)(this + 0x40);
    *(double *)(this + 0x30) = dVar3;
    *(double *)(this + 0x38) = *(double *)(this + 0x38) + *(double *)(this + 0x48);
    *(double *)(this + 0x40) = *(double *)(this + 0x50) + *(double *)(this + 0x40);
    *(double *)(this + 0x48) = *(double *)(this + 0x58) + *(double *)(this + 0x48);
    *x = dVar3;
    *y = *(double *)(this + 0x38);
    uVar1 = 2;
  }
  iVar2 = iVar2 + -1;
LAB_00111145:
  *(int *)(this + 4) = iVar2;
  return uVar1;
}

Assistant:

unsigned curve3_inc::vertex(double* x, double* y)
    {
        if(m_step < 0) return path_cmd_stop;
        if(m_step == m_num_steps)
        {
            *x = m_start_x;
            *y = m_start_y;
            --m_step;
            return path_cmd_move_to;
        }
        if(m_step == 0)
        {
            *x = m_end_x;
            *y = m_end_y;
            --m_step;
            return path_cmd_line_to;
        }
        m_fx  += m_dfx; 
        m_fy  += m_dfy;
        m_dfx += m_ddfx; 
        m_dfy += m_ddfy; 
        *x = m_fx;
        *y = m_fy;
        --m_step;
        return path_cmd_line_to;
    }